

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::AgeFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffc54;
  undefined4 in_stack_fffffffffffffc5c;
  FunctionNullHandling in_stack_fffffffffffffc68;
  allocator_type local_391;
  bind_lambda_function_t in_stack_fffffffffffffc70;
  LogicalType local_378;
  code *local_360 [2];
  code *local_350;
  code *local_348;
  code *local_340 [2];
  code *local_330;
  code *local_328;
  LogicalType local_320;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_308;
  LogicalType local_2f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2d8;
  LogicalType local_2c0;
  LogicalType local_2a8;
  string local_290;
  ScalarFunction local_270;
  ScalarFunction local_148;
  
  ::std::__cxx11::string::string((string *)&local_290,"age",(allocator *)&stack0xfffffffffffffc70);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_290);
  ::std::__cxx11::string::~string((string *)&local_290);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffc70,TIMESTAMP);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffffc70;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2d8,__l,&local_391);
  LogicalType::LogicalType(&local_2f0,INTERVAL);
  local_340[1] = (code *)0x0;
  local_340[0] = AgeFunctionStandard;
  local_328 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_330 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_2a8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_2a8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffc54;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffc5c;
  ScalarFunction::ScalarFunction
            (&local_148,(vector<duckdb::LogicalType,_true> *)&local_2d8,&local_2f0,
             (scalar_function_t *)local_340,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffc68,in_stack_fffffffffffffc70);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_148);
  ScalarFunction::~ScalarFunction(&local_148);
  LogicalType::~LogicalType(&local_2a8);
  ::std::_Function_base::~_Function_base((_Function_base *)local_340);
  LogicalType::~LogicalType(&local_2f0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2d8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffc70);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffc70,TIMESTAMP);
  LogicalType::LogicalType(&local_378,TIMESTAMP);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&stack0xfffffffffffffc70;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_308,__l_00,&local_391);
  LogicalType::LogicalType(&local_320,INTERVAL);
  local_360[1] = (code *)0x0;
  local_360[0] = AgeFunction;
  local_348 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_350 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_2c0,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_2c0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffc54;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffc5c;
  ScalarFunction::ScalarFunction
            (&local_270,(vector<duckdb::LogicalType,_true> *)&local_308,&local_320,
             (scalar_function_t *)local_360,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffffc68,in_stack_fffffffffffffc70);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_270);
  ScalarFunction::~ScalarFunction(&local_270);
  LogicalType::~LogicalType(&local_2c0);
  ::std::_Function_base::~_Function_base((_Function_base *)local_360);
  LogicalType::~LogicalType(&local_320);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_308);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffffc70 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return in_RDI;
}

Assistant:

ScalarFunctionSet AgeFun::GetFunctions() {
	ScalarFunctionSet age("age");
	age.AddFunction(ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::INTERVAL, AgeFunctionStandard));
	age.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP}, LogicalType::INTERVAL, AgeFunction));
	return age;
}